

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

int __thiscall
QFileDialogPrivate::select
          (QFileDialogPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  bool bVar1;
  char cVar2;
  QModelIndex *pQVar3;
  QItemSelectionModel *pQVar4;
  undefined4 in_register_00000034;
  QFileDialogPrivate *this_00;
  
  this_00 = (QFileDialogPrivate *)CONCAT44(in_register_00000034,__nfds);
  *(undefined1 **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x10 =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QDialogPrivate).super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8 =
       &DAT_aaaaaaaaaaaaaaaa;
  mapFromSource((QModelIndex *)this,this_00,(QModelIndex *)__readfds);
  bVar1 = QModelIndex::isValid((QModelIndex *)this);
  if (bVar1) {
    pQVar3 = (QModelIndex *)
             QAbstractItemView::selectionModel
                       ((QAbstractItemView *)((this_00->qFileDialogUi).d)->listView);
    cVar2 = QItemSelectionModel::isSelected(pQVar3);
    if (cVar2 == '\0') {
      pQVar4 = QAbstractItemView::selectionModel
                         ((QAbstractItemView *)((this_00->qFileDialogUi).d)->listView);
      (**(code **)(*(long *)pQVar4 + 0x68))(pQVar4,this,0x22);
    }
  }
  return (int)this;
}

Assistant:

QModelIndex QFileDialogPrivate::select(const QModelIndex &index) const {
    Q_ASSERT(index.isValid() ? index.model() == model : true);

    QModelIndex idx = mapFromSource(index);
    if (idx.isValid() && !qFileDialogUi->listView->selectionModel()->isSelected(idx))
        qFileDialogUi->listView->selectionModel()->select(idx,
            QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return idx;
}